

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O3

int md_process_table_row
              (MD_CTX *ctx,MD_BLOCKTYPE cell_type,MD_OFFSET beg,MD_OFFSET end,MD_ALIGN *align,
              int col_count)

{
  MD_ALIGN *pMVar1;
  MD_OFFSET MVar2;
  MD_MARK *pMVar3;
  int iVar4;
  MD_OFFSET *__ptr;
  ulong uVar5;
  _func_void_char_ptr_void_ptr *p_Var6;
  uint uVar7;
  void *pvVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  MD_LINE line;
  MD_LINE local_38;
  MD_OFFSET beg_00;
  
  local_38.beg = beg;
  local_38.end = end;
  iVar4 = md_analyze_inlines(ctx,&local_38,1,1);
  if (-1 < iVar4) {
    __ptr = (MD_OFFSET *)malloc((long)ctx->n_table_cell_boundaries * 4 + 8);
    if (__ptr != (MD_OFFSET *)0x0) {
      *__ptr = beg;
      uVar7 = ctx->table_cell_boundaries_head;
      if ((int)uVar7 < 0) {
        uVar5 = 1;
      }
      else {
        pMVar3 = ctx->marks;
        uVar5 = 1;
        do {
          __ptr[uVar5] = pMVar3[uVar7].end;
          uVar5 = uVar5 + 1;
          uVar7 = pMVar3[uVar7].next;
        } while (-1 < (int)uVar7);
        uVar5 = uVar5 & 0xffffffff;
      }
      __ptr[uVar5] = end + 1;
      iVar11 = 0;
      iVar4 = (*(ctx->parser).enter_block)(MD_BLOCK_TR,(void *)0x0,ctx->userdata);
      if (iVar4 == 0) {
        if (0 < col_count) {
          iVar11 = 0;
          uVar10 = 1;
          beg_00 = *__ptr;
          do {
            MVar2 = __ptr[uVar10];
            uVar7 = MVar2 - 1;
            if (beg_00 < uVar7) {
              iVar4 = md_process_table_cell(ctx,cell_type,align[iVar11],beg_00,uVar7);
              if (iVar4 < 0) goto LAB_00107c38;
              iVar11 = iVar11 + 1;
            }
          } while ((uVar10 < uVar5) && (uVar10 = uVar10 + 1, beg_00 = MVar2, iVar11 < col_count));
        }
        lVar12 = (long)iVar11;
        if (col_count < iVar11) {
          col_count = iVar11;
        }
        do {
          if (col_count == lVar12) {
            iVar4 = (*(ctx->parser).leave_block)(MD_BLOCK_TR,(void *)0x0,ctx->userdata);
            if (iVar4 == 0) {
              iVar4 = 0;
            }
            else {
              p_Var6 = (ctx->parser).debug_log;
              if (p_Var6 != (_func_void_char_ptr_void_ptr *)0x0) {
                pvVar8 = ctx->userdata;
                pcVar9 = "Aborted from leave_block() callback.";
                goto LAB_00107b56;
              }
            }
            break;
          }
          pMVar1 = align + lVar12;
          lVar12 = lVar12 + 1;
          iVar4 = md_process_table_cell(ctx,cell_type,*pMVar1,0,0);
        } while (-1 < iVar4);
      }
      else {
        p_Var6 = (ctx->parser).debug_log;
        if (p_Var6 != (_func_void_char_ptr_void_ptr *)0x0) {
          pvVar8 = ctx->userdata;
          pcVar9 = "Aborted from enter_block() callback.";
LAB_00107b56:
          (*p_Var6)(pcVar9,pvVar8);
        }
      }
      goto LAB_00107c38;
    }
    p_Var6 = (ctx->parser).debug_log;
    iVar4 = -1;
    if (p_Var6 != (_func_void_char_ptr_void_ptr *)0x0) {
      (*p_Var6)("malloc() failed.",ctx->userdata);
    }
  }
  __ptr = (MD_OFFSET *)0x0;
LAB_00107c38:
  free(__ptr);
  ctx->table_cell_boundaries_head = -1;
  ctx->table_cell_boundaries_tail = -1;
  return iVar4;
}

Assistant:

static int
md_process_table_row(MD_CTX* ctx, MD_BLOCKTYPE cell_type, OFF beg, OFF end,
                     const MD_ALIGN* align, int col_count)
{
    MD_LINE line;
    OFF* pipe_offs = NULL;
    int i, j, k, n;
    int ret = 0;

    line.beg = beg;
    line.end = end;

    /* Break the line into table cells by identifying pipe characters who
     * form the cell boundary. */
    MD_CHECK(md_analyze_inlines(ctx, &line, 1, TRUE));

    /* We have to remember the cell boundaries in local buffer because
     * ctx->marks[] shall be reused during cell contents processing. */
    n = ctx->n_table_cell_boundaries + 2;
    pipe_offs = (OFF*) malloc(n * sizeof(OFF));
    if(pipe_offs == NULL) {
        MD_LOG("malloc() failed.");
        ret = -1;
        goto abort;
    }
    j = 0;
    pipe_offs[j++] = beg;
    for(i = ctx->table_cell_boundaries_head; i >= 0; i = ctx->marks[i].next) {
        MD_MARK* mark = &ctx->marks[i];
        pipe_offs[j++] = mark->end;
    }
    pipe_offs[j++] = end+1;

    /* Process cells. */
    MD_ENTER_BLOCK(MD_BLOCK_TR, NULL);
    k = 0;
    for(i = 0; i < j-1  &&  k < col_count; i++) {
        if(pipe_offs[i] < pipe_offs[i+1]-1)
            MD_CHECK(md_process_table_cell(ctx, cell_type, align[k++], pipe_offs[i], pipe_offs[i+1]-1));
    }
    /* Make sure we call enough table cells even if the current table contains
     * too few of them. */
    while(k < col_count)
        MD_CHECK(md_process_table_cell(ctx, cell_type, align[k++], 0, 0));
    MD_LEAVE_BLOCK(MD_BLOCK_TR, NULL);

abort:
    free(pipe_offs);

    ctx->table_cell_boundaries_head = -1;
    ctx->table_cell_boundaries_tail = -1;

    return ret;
}